

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asset-resolution.cc
# Opt level: O0

string * __thiscall
tinyusdz::AssetResolutionResolver::resolve
          (string *__return_storage_ptr__,AssetResolutionResolver *this,string *assetPath)

{
  void *pvVar1;
  FSResolveAsset p_Var2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  char *pcVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_188;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  iterator local_130;
  size_type local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  string local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  string local_d0;
  string local_b0 [8];
  string rpath;
  int ret;
  void *userdata;
  string err;
  string resolvedPath;
  string ext;
  string *assetPath_local;
  AssetResolutionResolver *this_local;
  
  io::GetFileExtension((string *)((long)&resolvedPath.field_2 + 8),assetPath);
  sVar4 = ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
          ::count(&this->_asset_resolution_handlers,(key_type *)((long)&resolvedPath.field_2 + 8));
  if ((sVar4 == 0) ||
     (pmVar5 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
               ::at(&this->_asset_resolution_handlers,(key_type *)((long)&resolvedPath.field_2 + 8))
     , pmVar5->resolve_fun == (FSResolveAsset)0x0)) {
    ::std::__cxx11::string::string(local_b0);
    bVar3 = ::std::operator==(&this->_current_working_path,".");
    if ((bVar3) || (bVar3 = ::std::operator==(&this->_current_working_path,"./"), bVar3)) {
      memset(&local_e8,0,0x18);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_e8);
      io::FindFile(&local_d0,assetPath,&local_e8);
      ::std::__cxx11::string::operator=(local_b0,(string *)&local_d0);
      ::std::__cxx11::string::~string((string *)&local_d0);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_e8);
    }
    else {
      ::std::__cxx11::string::string((string *)&local_150,(string *)&this->_current_working_path);
      local_130 = &local_150;
      local_128 = 1;
      ::std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_151);
      __l._M_len = local_128;
      __l._M_array = local_130;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_120,__l,&local_151);
      io::FindFile(&local_108,assetPath,&local_120);
      ::std::__cxx11::string::operator=(local_b0,(string *)&local_108);
      ::std::__cxx11::string::~string((string *)&local_108);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_120);
      ::std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_151);
      local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130;
      do {
        local_188 = local_188 + -1;
        ::std::__cxx11::string::~string((string *)local_188);
      } while (local_188 != &local_150);
    }
    lVar7 = ::std::__cxx11::string::size();
    if (lVar7 == 0) {
      io::FindFile(__return_storage_ptr__,assetPath,&this->_search_paths);
    }
    else {
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,local_b0);
    }
    rpath.field_2._8_4_ = 1;
    ::std::__cxx11::string::~string(local_b0);
  }
  else {
    ::std::__cxx11::string::string((string *)(err.field_2._M_local_buf + 8));
    ::std::__cxx11::string::string((string *)&userdata);
    pmVar5 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
             ::at(&this->_asset_resolution_handlers,(key_type *)((long)&resolvedPath.field_2 + 8));
    pvVar1 = pmVar5->userdata;
    pmVar5 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
             ::at(&this->_asset_resolution_handlers,(key_type *)((long)&resolvedPath.field_2 + 8));
    p_Var2 = pmVar5->resolve_fun;
    pcVar6 = (char *)::std::__cxx11::string::c_str();
    rpath.field_2._12_4_ =
         (*p_Var2)(pcVar6,&this->_search_paths,(string *)((long)&err.field_2 + 8),
                   (string *)&userdata,pvVar1);
    if (rpath.field_2._12_4_ == 0) {
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,(string *)(err.field_2._M_local_buf + 8));
    }
    else {
      ::std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
    rpath.field_2._8_4_ = 1;
    ::std::__cxx11::string::~string((string *)&userdata);
    ::std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
  }
  ::std::__cxx11::string::~string((string *)(resolvedPath.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string AssetResolutionResolver::resolve(
    const std::string &assetPath) const {

  std::string ext = io::GetFileExtension(assetPath);

  if (_asset_resolution_handlers.count(ext)) {
    if (_asset_resolution_handlers.at(ext).resolve_fun) {
      std::string resolvedPath;
      std::string err;

      // Use custom handler's userdata
      void *userdata = _asset_resolution_handlers.at(ext).userdata;

      int ret = _asset_resolution_handlers.at(ext).resolve_fun(assetPath.c_str(), _search_paths, &resolvedPath, &err, userdata);
      if (ret != 0) {
        return std::string();
      }

      return resolvedPath;

    } else {
      DCOUT("Resolve function is nullptr. Fallback to built-in file handler.");
    }
  }

  DCOUT("cwd = " << _current_working_path);
  DCOUT("search_paths = " << _search_paths);
  DCOUT("assetPath = " << assetPath);

  std::string rpath;
  if ((_current_working_path == ".") || (_current_working_path == "./")) {
    rpath = io::FindFile(assetPath, {});
  } else {
    rpath = io::FindFile(assetPath, {_current_working_path});
  }

  if (rpath.size()) {
    return rpath;
  }

  // TODO: Cache resolition.
  return io::FindFile(assetPath, _search_paths);
}